

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> * __thiscall
libtorrent::bdecode_node::dict_at
          (pair<boost::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node>
           *__return_storage_ptr__,bdecode_node *this,int i)

{
  int iVar1;
  bdecode_node local_d8;
  bdecode_node local_88;
  string_view local_48;
  int local_34;
  int local_30;
  int value_token;
  int item;
  int token;
  bdecode_token *tokens;
  bdecode_node *pbStack_18;
  int i_local;
  bdecode_node *this_local;
  
  _item = this->m_root_tokens;
  value_token = this->m_token_idx + 1;
  local_30 = 0;
  if ((this->m_last_index <= i) && (this->m_last_index != -1)) {
    value_token = this->m_last_token;
    local_30 = this->m_last_index;
  }
  for (; local_30 < i; local_30 = local_30 + 1) {
    iVar1 = (SUB84(_item[value_token],4) & 0x1fffffff) + value_token;
    value_token = (SUB84(_item[iVar1],4) & 0x1fffffff) + iVar1;
  }
  if (0 < i) {
    this->m_last_token = value_token;
    this->m_last_index = i;
  }
  local_34 = value_token + (SUB84(_item[value_token],4) & 0x1fffffff);
  tokens._4_4_ = i;
  pbStack_18 = this;
  this_local = (bdecode_node *)__return_storage_ptr__;
  bdecode_node(&local_88,_item,this->m_buffer,this->m_buffer_size,value_token);
  local_48 = string_value(&local_88);
  bdecode_node(&local_d8,_item,this->m_buffer,this->m_buffer_size,local_34);
  std::make_pair<boost::basic_string_view<char,std::char_traits<char>>,libtorrent::bdecode_node>
            (__return_storage_ptr__,&local_48,&local_d8);
  ~bdecode_node(&local_d8);
  ~bdecode_node(&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::pair<string_view, bdecode_node> bdecode_node::dict_at(int i) const
	{
		TORRENT_ASSERT(type() == dict_t);
		TORRENT_ASSERT(m_token_idx != -1);

		bdecode_token const* tokens = m_root_tokens;
		TORRENT_ASSERT(tokens[m_token_idx].type == bdecode_token::dict);

		int token = m_token_idx + 1;
		int item = 0;

		// do we have a lookup cached?
		if (m_last_index <= i && m_last_index != -1)
		{
			token = m_last_token;
			item = m_last_index;
		}

		while (item < i)
		{
			TORRENT_ASSERT(tokens[token].type == bdecode_token::string);

			// skip the key
			token += tokens[token].next_item;
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

			// skip the value
			token += tokens[token].next_item;

			++item;

			// index 'i' out of range
			TORRENT_ASSERT(tokens[token].type != bdecode_token::end);
		}

		// there's no point in caching the first item
		if (i > 0)
		{
			m_last_token = token;
			m_last_index = i;
		}

		int value_token = token + tokens[token].next_item;
		TORRENT_ASSERT(tokens[token].type != bdecode_token::end);

		return std::make_pair(
			bdecode_node(tokens, m_buffer, m_buffer_size, token).string_value()
			, bdecode_node(tokens, m_buffer, m_buffer_size, value_token));
	}